

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_12a29d3::ParsedArguments::apply(ParsedArguments *this,Struct *reflectable)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  string property;
  
  for (p_Var2 = (this->selections)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->selections)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    property._M_dataplus._M_p = (pointer)&property.field_2;
    property._M_string_length = 0;
    property.field_2._M_local_buf[0] = '\0';
    p_Var1 = p_Var2[1]._M_parent;
    for (p_Var3 = (_Base_ptr)0x0; p_Var1 != p_Var3;
        p_Var3 = (_Base_ptr)((long)&p_Var3->_M_color + 1)) {
      std::__cxx11::string::push_back((char)&property);
    }
    if (p_Var2[2]._M_parent == (_Base_ptr)0x0) {
      Reflection::set<bool>(reflectable,&property,true,0);
    }
    else {
      Reflection::fuzzy_set(reflectable,&property,(string *)(p_Var2 + 2));
    }
    std::__cxx11::string::~string((string *)&property);
  }
  return;
}

Assistant:

void apply(Reflection::Struct *reflectable) const {
		for(const auto &argument: selections) {
			// Replace any dashes with underscores in the argument name.
			std::string property;
			std::transform(argument.first.begin(), argument.first.end(), std::back_inserter(property), [](char c) { return c == '-' ? '_' : c; });

			if(argument.second.empty()) {
				Reflection::set<bool>(*reflectable, property, true);
			} else {
				Reflection::fuzzy_set(*reflectable, property, argument.second);
			}
		}
	}